

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

bool __thiscall MakefileGenerator::writeDummyMakefile(MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *pQVar1;
  long lVar2;
  ProStringList *pPVar3;
  QTextStream *pQVar4;
  ProString *str;
  long in_FS_OFFSET;
  QArrayData *local_80 [3];
  ProKey local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->project;
  ProKey::ProKey(&local_68,"QMAKE_FAILED_REQUIREMENTS");
  pPVar3 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_68);
  lVar2 = (pPVar3->super_QList<ProString>).d.size;
  if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (lVar2 != 0) {
    pQVar4 = (QTextStream *)QTextStream::operator<<(t,"QMAKE    = ");
    ProKey::ProKey(&local_68,"QMAKE_QMAKE");
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(local_80,this,&local_68);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_80);
    Qt::endl(pQVar4);
    if (local_80[0] != (QArrayData *)0x0) {
      LOCK();
      (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_80[0],2,0x10);
      }
    }
    if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar1 = this->project;
    ProKey::ProKey(&local_68,"QMAKE_EXTRA_TARGETS");
    pPVar3 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_68);
    if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((pPVar3->super_QList<ProString>).d.size != 0) {
      str = (pPVar3->super_QList<ProString>).d.ptr;
      do {
        pQVar4 = operator<<(t,str);
        QTextStream::operator<<(pQVar4," ");
        str = str + 1;
      } while (str != (pPVar3->super_QList<ProString>).d.ptr +
                      (pPVar3->super_QList<ProString>).d.size);
    }
    pQVar4 = (QTextStream *)
             QTextStream::operator<<(t,"first all clean install distclean uninstall qmake_all:\n\t")
    ;
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,"@echo \"Some of the required modules (")
    ;
    ProKey::ProKey(&local_68,"QMAKE_FAILED_REQUIREMENTS");
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[0x16])(local_80,this,&local_68);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,(QString *)local_80);
    pQVar4 = (QTextStream *)QTextStream::operator<<(pQVar4,") are not available.\"\n\t");
    QTextStream::operator<<(pQVar4,"@echo \"Skipped.\"\n\n");
    if (local_80[0] != (QArrayData *)0x0) {
      LOCK();
      (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_80[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_80[0],2,0x10);
      }
    }
    if (&(local_68.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    writeMakeQmake(this,t,false);
    QTextStream::operator<<(t,"FORCE:\n\n");
    (*(this->super_QMakeSourceFileInfo)._vptr_QMakeSourceFileInfo[7])(this,t);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return lVar2 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool
MakefileGenerator::writeDummyMakefile(QTextStream &t)
{
    if (project->values("QMAKE_FAILED_REQUIREMENTS").isEmpty())
        return false;
    t << "QMAKE    = " << var("QMAKE_QMAKE") << Qt::endl;
    const ProStringList &qut = project->values("QMAKE_EXTRA_TARGETS");
    for (ProStringList::ConstIterator it = qut.begin(); it != qut.end(); ++it)
        t << *it << " ";
    t << "first all clean install distclean uninstall qmake_all:\n\t"
      << "@echo \"Some of the required modules ("
      << var("QMAKE_FAILED_REQUIREMENTS") << ") are not available.\"\n\t"
      << "@echo \"Skipped.\"\n\n";
    writeMakeQmake(t);
    t << "FORCE:\n\n";
    suppressBuiltinRules(t);
    return true;
}